

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O0

int __thiscall Abstract<8U>::rename(Abstract<8U> *this,char *__old,char *__new)

{
  int iVar1;
  char *__s;
  char *tp;
  
  __s = (char *)operator_new__(0x14);
  sprintf(__s,"WavingSketch<%d,%d>",(ulong)__old & 0xffffffff,(ulong)__new & 0xffffffff);
  iVar1 = std::__cxx11::string::operator=((string *)&this->name,__s);
  return iVar1;
}

Assistant:

void rename(int slot_num, int counter_num) {
		char* tp = new char[20];
		std::sprintf(tp, "WavingSketch<%d,%d>", slot_num, counter_num);
		name = tp;
	}